

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer_interface.cc
# Opt level: O3

TrainerInterface * __thiscall
sentencepiece::TrainerInterface::InitMetaPieces(TrainerInterface *this)

{
  ostringstream *poVar1;
  bool bVar2;
  string *psVar3;
  int iVar4;
  long lVar5;
  long in_RSI;
  long lVar6;
  bool has_unk;
  anon_class_16_2_878a7968 insert_id;
  anon_class_24_3_df37360f insert_meta_symbol;
  int id;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dup;
  bool local_201;
  anon_class_16_2_878a7968 local_200;
  string local_1f0;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [8];
  _Rb_tree_node_base local_1a8;
  size_t local_188;
  ios_base local_138 [264];
  
  if (*(long *)(in_RSI + 0x288) == 0) {
    local_200.has_unk = &local_201;
    local_201 = false;
    iVar4 = *(int *)(in_RSI + 0x174);
    if (*(ulong *)(in_RSI + 0x128) == 0) {
      psVar3 = _ToString_abi_cxx11_;
      if (_ToString_abi_cxx11_ == (string *)0x0) {
        psVar3 = (string *)google::protobuf::internal::LazyString::Init_abi_cxx11_();
      }
    }
    else {
      psVar3 = (string *)(*(ulong *)(in_RSI + 0x128) & 0xfffffffffffffffe);
    }
    bVar2 = InitMetaPieces::anon_class_16_2_878a7968::operator()(&local_200,iVar4,psVar3);
    if (bVar2) {
      iVar4 = *(int *)(in_RSI + 0x1b4);
      if (*(ulong *)(in_RSI + 0x130) == 0) {
        psVar3 = TrainerSpec::_i_give_permission_to_break_this_code_default_unk_piece_;
        if (TrainerSpec::_i_give_permission_to_break_this_code_default_unk_piece_ == (string *)0x0)
        {
          psVar3 = (string *)google::protobuf::internal::LazyString::Init_abi_cxx11_();
        }
      }
      else {
        psVar3 = (string *)(*(ulong *)(in_RSI + 0x130) & 0xfffffffffffffffe);
      }
      bVar2 = InitMetaPieces::anon_class_16_2_878a7968::operator()(&local_200,iVar4,psVar3);
      if (bVar2) {
        iVar4 = *(int *)(in_RSI + 0x1b8);
        if (*(ulong *)(in_RSI + 0x138) == 0) {
          psVar3 = _code;
          if (_code == (string *)0x0) {
            psVar3 = (string *)google::protobuf::internal::LazyString::Init_abi_cxx11_();
          }
        }
        else {
          psVar3 = (string *)(*(ulong *)(in_RSI + 0x138) & 0xfffffffffffffffe);
        }
        bVar2 = InitMetaPieces::anon_class_16_2_878a7968::operator()(&local_200,iVar4,psVar3);
        if (bVar2) {
          iVar4 = *(int *)(in_RSI + 0x1bc);
          if (*(ulong *)(in_RSI + 0x140) == 0) {
            psVar3 = _snprintf;
            if (_snprintf == (string *)0x0) {
              psVar3 = (string *)google::protobuf::internal::LazyString::Init_abi_cxx11_();
            }
          }
          else {
            psVar3 = (string *)(*(ulong *)(in_RSI + 0x140) & 0xfffffffffffffffe);
          }
          bVar2 = InitMetaPieces::anon_class_16_2_878a7968::operator()(&local_200,iVar4,psVar3);
          if (bVar2) {
            if (local_201 != false) {
              local_1a8._M_left = (_Base_ptr)(local_1b0 + 8);
              local_1a8._M_color = _S_red;
              local_1a8._M_parent = (_Base_ptr)0x0;
              local_188 = 0;
              local_1f0._M_dataplus._M_p = (pointer)((long)&local_1f0.field_2 + 0xc);
              local_1f0.field_2._12_4_ = 0;
              local_1f0._M_string_length = (size_type)local_1b0;
              lVar6 = *(long *)(in_RSI + 0xe8) + 8;
              if (*(long *)(in_RSI + 0xe8) == 0) {
                lVar6 = 0;
              }
              iVar4 = *(int *)(in_RSI + 0xe0);
              local_1a8._M_right = local_1a8._M_left;
              if ((long)iVar4 != 0) {
                lVar5 = 0;
                do {
                  InitMetaPieces::anon_class_24_3_df37360f::operator()
                            ((anon_class_24_3_df37360f *)this,&local_1f0,
                             (Type)*(undefined8 *)(lVar6 + lVar5));
                  if (this->_vptr_TrainerInterface != (_func_int **)0x0) goto LAB_00150f95;
                  sentencepiece::util::Status::~Status((Status *)this);
                  lVar5 = lVar5 + 8;
                } while ((long)iVar4 * 8 != lVar5);
              }
              lVar6 = *(long *)(in_RSI + 0x100) + 8;
              if (*(long *)(in_RSI + 0x100) == 0) {
                lVar6 = 0;
              }
              iVar4 = *(int *)(in_RSI + 0xf8);
              if ((long)iVar4 != 0) {
                lVar5 = 0;
                do {
                  InitMetaPieces::anon_class_24_3_df37360f::operator()
                            ((anon_class_24_3_df37360f *)this,&local_1f0,
                             (Type)*(undefined8 *)(lVar6 + lVar5));
                  if (this->_vptr_TrainerInterface != (_func_int **)0x0) goto LAB_00150f95;
                  sentencepiece::util::Status::~Status((Status *)this);
                  lVar5 = lVar5 + 8;
                } while ((long)iVar4 * 8 != lVar5);
              }
              if (*(char *)(in_RSI + 0x170) == '\x01') {
                iVar4 = 0;
                do {
                  sentencepiece::ByteToPiece_abi_cxx11_((uchar)local_1d0);
                  InitMetaPieces::anon_class_24_3_df37360f::operator()
                            ((anon_class_24_3_df37360f *)this,&local_1f0,(Type)local_1d0);
                  if (local_1d0[0] != local_1c0) {
                    operator_delete(local_1d0[0],local_1c0[0] + 1);
                  }
                  if (this->_vptr_TrainerInterface != (_func_int **)0x0) goto LAB_00150f95;
                  sentencepiece::util::Status::~Status((Status *)this);
                  iVar4 = iVar4 + 1;
                } while (iVar4 != 0x100);
              }
              sentencepiece::util::Status::Status((Status *)this);
LAB_00150f95:
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1b0);
              return this;
            }
            poVar1 = (ostringstream *)(local_1b0 + 8);
            local_1b0._0_4_ = 0xd;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"src/trainer_interface.cc",0x18);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
            std::ostream::operator<<((ostream *)poVar1,0x2f8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") [",3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"has_unk",7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] ",2);
            if (*(ulong *)(in_RSI + 0x128) == 0) {
              psVar3 = _ToString_abi_cxx11_;
              if (_ToString_abi_cxx11_ == (string *)0x0) {
                psVar3 = (string *)google::protobuf::internal::LazyString::Init_abi_cxx11_();
              }
            }
            else {
              psVar3 = (string *)(*(ulong *)(in_RSI + 0x128) & 0xfffffffffffffffe);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," must be defined.",0x11);
            util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
          }
          else {
            poVar1 = (ostringstream *)(local_1b0 + 8);
            local_1b0._0_4_ = 0xd;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"src/trainer_interface.cc",0x18);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
            std::ostream::operator<<((ostream *)poVar1,0x2f6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") [",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "insert_id(trainer_spec_.pad_id(), trainer_spec_.pad_piece())",0x3c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] ",2);
            util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
          }
        }
        else {
          poVar1 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_4_ = 0xd;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"src/trainer_interface.cc",0x18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
          std::ostream::operator<<((ostream *)poVar1,0x2f5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "insert_id(trainer_spec_.eos_id(), trainer_spec_.eos_piece())",0x3c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] ",2);
          util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
        }
      }
      else {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_4_ = 0xd;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"src/trainer_interface.cc",0x18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
        std::ostream::operator<<((ostream *)poVar1,0x2f4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"insert_id(trainer_spec_.bos_id(), trainer_spec_.bos_piece())",
                   0x3c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] ",2);
        util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
      }
    }
    else {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_4_ = 0xd;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"src/trainer_interface.cc",0x18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
      std::ostream::operator<<((ostream *)poVar1,0x2f3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"insert_id(trainer_spec_.unk_id(), trainer_spec_.unk_piece())",
                 0x3c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] ",2);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    }
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"src/trainer_interface.cc",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
    std::ostream::operator<<((ostream *)poVar1,0x2e3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"meta_pieces_.empty()",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] ",2);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  return this;
}

Assistant:

util::Status TrainerInterface::InitMetaPieces() {
  CHECK_OR_RETURN(meta_pieces_.empty());
  bool has_unk = false;

  auto insert_id = [&has_unk, this](int id, const std::string &w) -> bool {
    if (id < 0) return true;
    if (id >= trainer_spec_.vocab_size() ||
        meta_pieces_.find(id) != meta_pieces_.end() ||
        (has_unk && w == trainer_spec_.unk_piece()))
      return false;
    if (w == trainer_spec_.unk_piece()) has_unk = true;
    meta_pieces_[id] = std::make_pair(
        w, w == trainer_spec_.unk_piece() ? ModelProto::SentencePiece::UNKNOWN
                                          : ModelProto::SentencePiece::CONTROL);
    return true;
  };

  CHECK_OR_RETURN(insert_id(trainer_spec_.unk_id(), trainer_spec_.unk_piece()));
  CHECK_OR_RETURN(insert_id(trainer_spec_.bos_id(), trainer_spec_.bos_piece()));
  CHECK_OR_RETURN(insert_id(trainer_spec_.eos_id(), trainer_spec_.eos_piece()));
  CHECK_OR_RETURN(insert_id(trainer_spec_.pad_id(), trainer_spec_.pad_piece()));

  CHECK_OR_RETURN(has_unk) << trainer_spec_.unk_piece() << " must be defined.";

  std::set<std::string> dup;

  int id = 0;
  auto insert_meta_symbol =
      [&id, &dup, this](const std::string &w,
                        ModelProto::SentencePiece::Type type) -> util::Status {
    if (!dup.insert(w).second) {
      return util::InternalError(absl::StrCat(
          w, " is already defined. duplicated symbols are not allowed."));
    }

    if (w == trainer_spec_.unk_piece()) {
      return util::InternalError(
          absl::StrCat(trainer_spec_.unk_piece(),
                       " must not be defined with --control_symbols and "
                       "--user_defined_symbols."));
    }

    if (w == trainer_spec_.bos_piece() && trainer_spec_.bos_id() >= 0) {
      meta_pieces_[trainer_spec_.bos_id()].second = type;
    } else if (w == trainer_spec_.eos_piece() && trainer_spec_.eos_id() >= 0) {
      meta_pieces_[trainer_spec_.eos_id()].second = type;
    } else if (w == trainer_spec_.pad_piece() && trainer_spec_.pad_id() >= 0) {
      meta_pieces_[trainer_spec_.pad_id()].second = type;
    } else {
      while (meta_pieces_.find(id) != meta_pieces_.end()) ++id;
      meta_pieces_[id] = std::make_pair(w, type);
    }

    return util::OkStatus();
  };

  for (const auto &w : trainer_spec_.control_symbols()) {
    RETURN_IF_ERROR(insert_meta_symbol(w, ModelProto::SentencePiece::CONTROL));
  }

  for (const auto &w : trainer_spec_.user_defined_symbols()) {
    RETURN_IF_ERROR(
        insert_meta_symbol(w, ModelProto::SentencePiece::USER_DEFINED));
  }

  if (trainer_spec_.byte_fallback()) {
    for (int i = 0; i < 256; ++i) {
      RETURN_IF_ERROR(
          insert_meta_symbol(ByteToPiece(i), ModelProto::SentencePiece::BYTE));
    }
  }

  return util::OkStatus();
}